

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O2

matroska_cuepoint * MATROSKA_CuesGetTimestampStart(ebml_element *Cues,mkv_timestamp_t Timestamp)

{
  matroska_cuepoint *pmVar1;
  ebml_context *Context;
  bool_t bVar2;
  matroska_cuepoint *Cue;
  mkv_timestamp_t mVar3;
  matroska_cuepoint *pmVar4;
  
  if (Cues == (ebml_element *)0x0) {
    __assert_fail("Cues!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x88c,
                  "matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *, mkv_timestamp_t)"
                 );
  }
  Context = MATROSKA_getContextCues();
  bVar2 = EBML_ElementIsType(Cues,Context);
  if (bVar2 == 0) {
    __assert_fail("EBML_ElementIsType(Cues, MATROSKA_getContextCues())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x88d,
                  "matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *, mkv_timestamp_t)"
                 );
  }
  if (Timestamp == 0x7fffffffffffffff) {
    pmVar4 = (matroska_cuepoint *)0x0;
  }
  else {
    pmVar1 = (matroska_cuepoint *)(Cues->Base).Children;
    pmVar4 = (matroska_cuepoint *)0x0;
    while (Cue = pmVar1, Cue != (matroska_cuepoint *)0x0) {
      mVar3 = MATROSKA_CueTimestamp(Cue);
      if (Timestamp < mVar3) break;
      pmVar1 = (matroska_cuepoint *)(Cue->Base).Base.Base.Next;
      pmVar4 = Cue;
      if (Cue == pmVar1) {
        __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x891,
                      "matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *, mkv_timestamp_t)"
                     );
      }
    }
    if (pmVar4 == (matroska_cuepoint *)0x0) {
      pmVar4 = (matroska_cuepoint *)(Cues->Base).Children;
    }
  }
  return pmVar4;
}

Assistant:

matroska_cuepoint *MATROSKA_CuesGetTimestampStart(const ebml_element *Cues, mkv_timestamp_t Timestamp)
{
    matroska_cuepoint *Elt,*Prev=NULL;

    assert(Cues!=NULL);
    assert(EBML_ElementIsType(Cues, MATROSKA_getContextCues()));
    if (Timestamp==INVALID_TIMESTAMP_T)
        return NULL;

    for (Elt=(matroska_cuepoint*)EBML_MasterChildren(Cues);Elt;Prev=Elt, Elt=(matroska_cuepoint*)EBML_MasterNext(Elt))
    {
        if (MATROSKA_CueTimestamp(Elt) > Timestamp)
            break;
    }

    return Prev ? Prev : (matroska_cuepoint*)EBML_MasterChildren(Cues);
}